

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gymplayer.cpp
# Opt level: O0

UINT8 __thiscall GYMPlayer::LoadFile(GYMPlayer *this,DATA_LOADER *dataLoader)

{
  byte bVar1;
  UINT32 UVar2;
  UINT8 *pUVar3;
  UINT8 retVal;
  DATA_LOADER *dataLoader_local;
  GYMPlayer *this_local;
  
  this->_dLoad = (DATA_LOADER *)0x0;
  DataLoader_ReadUntil(dataLoader,0x1ac);
  pUVar3 = DataLoader_GetData(dataLoader);
  this->_fileData = pUVar3;
  UVar2 = DataLoader_GetSize(dataLoader);
  if (UVar2 < 4) {
    this_local._7_1_ = 0xf0;
  }
  else {
    (this->_fileHdr).hasHeader = (*(int *)this->_fileData != 0x584d5947 ^ 0xffU) & 1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->_decFData);
    if ((this->_fileHdr).hasHeader == '\0') {
      (this->_fileHdr).uncomprSize = 0;
      (this->_fileHdr).loopFrame = 0;
      (this->_fileHdr).dataOfs = 0;
    }
    else {
      UVar2 = DataLoader_GetSize(dataLoader);
      if (UVar2 < 0x1ac) {
        return 0xf1;
      }
      UVar2 = ReadLE32(this->_fileData + 0x1a4);
      (this->_fileHdr).loopFrame = UVar2;
      UVar2 = ReadLE32(this->_fileData + 0x1a8);
      (this->_fileHdr).uncomprSize = UVar2;
      (this->_fileHdr).dataOfs = 0x1ac;
    }
    this->_dLoad = dataLoader;
    DataLoader_ReadAll(this->_dLoad);
    pUVar3 = DataLoader_GetData(this->_dLoad);
    this->_fileData = pUVar3;
    UVar2 = DataLoader_GetSize(this->_dLoad);
    this->_fileLen = UVar2;
    LoadTags(this);
    if (((this->_fileHdr).uncomprSize == 0) ||
       (bVar1 = DecompressZlibData(this), (bVar1 & 0x80) == 0)) {
      (this->_fileHdr).realFileSize = this->_fileLen;
      CalcSongLength(this);
      this_local._7_1_ = '\0';
    }
    else {
      this_local._7_1_ = 0xff;
    }
  }
  return this_local._7_1_;
}

Assistant:

UINT8 GYMPlayer::LoadFile(DATA_LOADER *dataLoader)
{
	_dLoad = NULL;
	DataLoader_ReadUntil(dataLoader,0x1AC);	// try to read the full GYMX header
	_fileData = DataLoader_GetData(dataLoader);
	if (DataLoader_GetSize(dataLoader) < 0x04)
		return 0xF0;	// invalid file
	
	_fileHdr.hasHeader = ! memcmp(&_fileData[0x00], "GYMX", 4);
	_decFData.clear();
	if (! _fileHdr.hasHeader)
	{
		_fileHdr.uncomprSize = 0;
		_fileHdr.loopFrame = 0;
		_fileHdr.dataOfs = 0x00;
	}
	else
	{
		if (DataLoader_GetSize(dataLoader) < 0x1AC)
			return 0xF1;	// file too small
		_fileHdr.loopFrame = ReadLE32(&_fileData[0x1A4]);
		_fileHdr.uncomprSize = ReadLE32(&_fileData[0x1A8]);
		_fileHdr.dataOfs = 0x1AC;
	}
	
	_dLoad = dataLoader;
	DataLoader_ReadAll(_dLoad);
	_fileData = DataLoader_GetData(_dLoad);
	_fileLen = DataLoader_GetSize(_dLoad);
	
	LoadTags();
	
	if (_fileHdr.uncomprSize > 0)
	{
		UINT8 retVal = DecompressZlibData();
		if (retVal & 0x80)
			return 0xFF;	// decompression error
	}
	_fileHdr.realFileSize = _fileLen;
	
	CalcSongLength();
	
	return 0x00;
}